

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O1

void __thiscall xray_re::xr_spawn_object::load(xr_spawn_object *this,xr_reader *r)

{
  undefined1 *dest;
  uint uVar1;
  uint *puVar2;
  uint8_t *puVar3;
  float *pfVar4;
  uint32_t *puVar5;
  size_t sVar6;
  char *name;
  cse_abstract *this_00;
  uint16_t version;
  xr_custom_object_vec objects;
  short local_104a;
  undefined1 local_1048 [8];
  pointer ppxStack_1040;
  pointer local_1038;
  
  sVar6 = xr_reader::r_raw_chunk(r,0xe411,&local_104a,2);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                  ,0x31,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
  }
  if (local_104a != 0x14) {
    __assert_fail("version == SPAWNPOINT_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                  ,0x32,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,r);
  sVar6 = xr_reader::find_chunk(r,0xe419);
  dest = &(this->super_xr_custom_object).field_0x6c;
  if (sVar6 == 0) {
    xr_reader::r_raw_chunk(r,0xe417,dest,4);
    if (*(int *)dest == 1) {
      sVar6 = xr_reader::find_chunk(r,0xe422);
      if (sVar6 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                      ,0x50,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
      }
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->field_1).field_1.m_radius = *pfVar4;
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->field_1).field_1.m_power = *pfVar4;
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->field_1).field_1.m_view_distance = *pfVar4;
      puVar5 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
      (this->field_1).field_1.m_fog_color = *puVar5;
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->field_1).field_1.m_fog_density = *pfVar4;
      puVar5 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
      (this->field_1).field_1.m_ambient_color = *puVar5;
      puVar5 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
      (this->field_1).field_1.m_sky_color = *puVar5;
      xr_reader::r_raw_chunk(r,0xe423,(void *)((long)&this->field_1 + 0x1c),4);
    }
    else {
      if (*(int *)dest != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                      ,0x5b,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
      }
      sVar6 = xr_reader::find_chunk(r,0xe413);
      if (sVar6 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                      ,0x48,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
      }
      puVar3 = (r->field_2).m_p;
      (r->field_2).m_p = puVar3 + 1;
      (this->field_1).field_0.m_team = *puVar3;
      puVar3 = (r->field_2).m_p;
      (r->field_2).m_p = puVar3 + 1;
      (this->field_1).field_0.m_respawn = *puVar3;
      puVar3 = (r->field_2).m_p;
      (r->field_2).m_p = puVar3 + 1;
      (this->field_1).field_0.m_game = *puVar3;
      puVar3 = (r->field_2).m_p;
      (r->field_2).m_p = puVar3 + 1;
      if (r->m_end < puVar3 + 1) {
        __assert_fail("m_p <= m_end",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                      ,0x7c,"void xray_re::xr_reader::advance(size_t)");
      }
    }
  }
  else {
    *(undefined4 *)dest = 2;
    name = xr_reader::skip_sz(r);
    sVar6 = xr_reader::find_chunk(r,0xe420);
    if (sVar6 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0x3c,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
    }
    puVar2 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    uVar1 = *puVar2;
    xr_packet::xr_packet((xr_packet *)local_1048);
    xr_reader::r_packet(r,(xr_packet *)local_1048,(ulong)uVar1);
    this_00 = create_entity(name);
    (this->field_1).m_entity = this_00;
    if (this_00 == (cse_abstract *)0x0) {
      __assert_fail("m_entity",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0x42,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
    }
    cse_abstract::spawn_read(this_00,(xr_packet *)local_1048);
  }
  local_1048 = (undefined1  [8])0x0;
  ppxStack_1040 = (pointer)0x0;
  local_1038 = (pointer)0x0;
  xr_scene::load_objects
            ((this->super_xr_custom_object).m_scene,r,0xe421,(xr_custom_object_vec *)local_1048);
  if (local_1048 != (undefined1  [8])ppxStack_1040) {
    if (((long)ppxStack_1040 - (long)local_1048 != 8) ||
       ((*(xr_custom_object **)local_1048)->m_class_id != TOOLS_CLASS_SHAPE)) {
      __assert_fail("objects.size() == 1 && objects[0]->class_id() == TOOLS_CLASS_SHAPE",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0x62,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
    }
    this->m_attached_object = *(xr_custom_object **)local_1048;
  }
  if (local_1048 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1048,(long)local_1038 - (long)local_1048);
  }
  return;
}

Assistant:

void xr_spawn_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk(SPAWNPOINT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SPAWNPOINT_VERSION);

	xr_custom_object::load(r);

	if (r.find_chunk(SPAWNPOINT_CHUNK_SECTION)) {
		m_type = SPAWNPOINT_TYPE_ENTITY;
		const char* name = r.skip_sz();
		r.debug_find_chunk();

		if (!r.find_chunk(SPAWNPOINT_CHUNK_SPAWNDATA))
			xr_not_expected();
		size_t size = r.r_u32();
		xr_packet packet;
		r.r_packet(packet, size);
		r.debug_find_chunk();
		m_entity = create_entity(name);
		xr_assert(m_entity);
		m_entity->spawn_read(packet);
	} else {
		r.r_chunk<uint32_t>(SPAWNPOINT_CHUNK_TYPE, m_type);
		if (m_type == SPAWNPOINT_TYPE_RPOINT) {
			if (!r.find_chunk(SPAWNPOINT_CHUNK_RPOINT_PARAMS))
				xr_not_expected();
			m_team = r.r_u8();
			m_respawn = r.r_u8();
			m_game = r.r_u8();
			r.advance(sizeof(uint8_t));
			r.debug_find_chunk();
		} else if (m_type == SPAWNPOINT_TYPE_ENV_MOD) {
			if (!r.find_chunk(SPAWNPOINT_CHUNK_ENV_MOD_PARAMS))
				xr_not_expected();
			m_radius = r.r_float();
			m_power = r.r_float();
			m_view_distance = r.r_float();
			m_fog_color = r.r_u32();
			m_fog_density = r.r_float();
			m_ambient_color = r.r_u32();
			m_sky_color = r.r_u32();
			r.debug_find_chunk();
			r.r_chunk<uint32_t>(SPAWNPOINT_CHUNK_ENV_MOD_HEMI, m_hemi_color);
		} else {
			xr_not_expected();
		}
	}

	xr_custom_object_vec objects;
	scene().load_objects(r, SPAWNPOINT_CHUNK_ATTACHED_OBJECT, objects);
	if (!objects.empty()) {
		xr_assert(objects.size() == 1 && objects[0]->class_id() == TOOLS_CLASS_SHAPE);
		m_attached_object = objects[0];
	}
}